

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_do_visit_block_container
          (Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,size_t node,size_t next_level,size_t do_indent)

{
  pfn_error p_Var1;
  code *pcVar2;
  size_t sVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  bool bVar9;
  error_flags eVar10;
  NodeData *pNVar11;
  size_t sVar12;
  NodeScalar *pNVar13;
  NodeType NVar14;
  size_t sVar15;
  RepC rc;
  RepC rc_00;
  RepC rc_01;
  RepC rc_02;
  RepC rc_03;
  RepC rc_04;
  csubstr cVar16;
  size_t sStackY_160;
  char msg [37];
  char *pcStack_e0;
  size_t local_d8;
  char *pcStack_b8;
  size_t local_b0;
  char *pcStack_90;
  size_t local_88;
  char *pcStack_68;
  size_t local_60;
  char *pcStack_40;
  size_t local_38;
  
  sVar3 = next_level * 2;
  pNVar11 = Tree::_p(this->m_tree,node);
  if (((pNVar11->m_type).type & SEQ) == NOTYPE) {
    pNVar11 = Tree::_p(this->m_tree,node);
    if (((pNVar11->m_type).type & MAP) == NOTYPE) {
      builtin_strncpy(msg,"check failed: (m_tree->is_map(node))",0x24);
      stack0xfffffffffffffefc = stack0xfffffffffffffefc & 0xffffff00;
      eVar10 = get_error_flags();
      if ((eVar10 & 1) != 0) {
        bVar9 = is_debugger_attached();
        if (bVar9) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
      }
      p_Var1 = (this->m_tree->m_callbacks).m_error;
      cVar16 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_88 = cVar16.len;
      pcStack_90 = cVar16.str;
      LVar4.super_LineCol.col = 0;
      LVar4.super_LineCol.offset = SUB168(ZEXT816(0x5953) << 0x40,0);
      LVar4.super_LineCol.line = SUB168(ZEXT816(0x5953) << 0x40,8);
      LVar4.name.str = pcStack_90;
      LVar4.name.len = local_88;
      (*p_Var1)(msg,0x25,LVar4,(this->m_tree->m_callbacks).m_user_data);
    }
    sVar12 = Tree::first_child(this->m_tree,node);
    sVar15 = sVar3 * do_indent;
    while (sVar12 != 0xffffffffffffffff) {
      pNVar11 = Tree::_p(this->m_tree,sVar12);
      if (((pNVar11->m_type).type & KEY) == NOTYPE) {
        builtin_strncpy(msg,"check failed: (m_tree->has_key(ich))",0x24);
        stack0xfffffffffffffefc = stack0xfffffffffffffefc & 0xffffff00;
        eVar10 = get_error_flags();
        if ((eVar10 & 1) != 0) {
          bVar9 = is_debugger_attached();
          if (bVar9) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
        }
        p_Var1 = (this->m_tree->m_callbacks).m_error;
        cVar16 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        local_b0 = cVar16.len;
        pcStack_b8 = cVar16.str;
        LVar5.super_LineCol.col = 0;
        LVar5.super_LineCol.offset = SUB168(ZEXT816(0x5956) << 0x40,0);
        LVar5.super_LineCol.line = SUB168(ZEXT816(0x5956) << 0x40,8);
        LVar5.name.str = pcStack_b8;
        LVar5.name.len = local_b0;
        (*p_Var1)(msg,0x25,LVar5,(this->m_tree->m_callbacks).m_user_data);
      }
      pNVar11 = Tree::_p(this->m_tree,sVar12);
      if ((~(int)(pNVar11->m_type).type & 3U) == 0) {
        rc.num_times = sVar15;
        rc._0_8_ = 0x20;
        WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(&this->
                     super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ,rc);
        pNVar13 = Tree::keysc(this->m_tree,sVar12);
        pNVar11 = Tree::_p(this->m_tree,sVar12);
        _write(this,(int)pNVar13,(void *)(ulong)((uint)(pNVar11->m_type).type & 0x2aa2142),
               next_level);
        WriterOStream<std::__cxx11::ostringstream>::_do_write<3ul>
                  ((WriterOStream<std::__cxx11::ostringstream> *)this,(char (*) [3])0x1e7078);
        pNVar13 = Tree::valsc(this->m_tree,sVar12);
        pNVar11 = Tree::_p(this->m_tree,sVar12);
        _write(this,(int)pNVar13,(void *)(ulong)((uint)(pNVar11->m_type).type & 0x5541281),
               next_level);
LAB_00195731:
        WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(&this->
                     super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ,'\n');
      }
      else {
        pNVar11 = Tree::_p(this->m_tree,sVar12);
        if (((pNVar11->m_type).type & (STREAM|MAP)) == NOTYPE) {
          msg[0x20] = 'n';
          msg[0x21] = 'e';
          msg[0x22] = 'r';
          msg[0x23] = '(';
          stack0xfffffffffffffefc = 0x29686369;
          msg[0x10] = '_';
          msg[0x11] = 't';
          msg[0x12] = 'r';
          msg[0x13] = 'e';
          msg[0x14] = 'e';
          msg[0x15] = '-';
          msg[0x16] = '>';
          msg[0x17] = 'i';
          msg[0x18] = 's';
          msg[0x19] = '_';
          msg[0x1a] = 'c';
          msg[0x1b] = 'o';
          msg[0x1c] = 'n';
          msg[0x1d] = 't';
          msg[0x1e] = 'a';
          msg[0x1f] = 'i';
          msg[0] = 'c';
          msg[1] = 'h';
          msg[2] = 'e';
          msg[3] = 'c';
          msg[4] = 'k';
          msg[5] = ' ';
          msg[6] = 'f';
          msg[7] = 'a';
          msg[8] = 'i';
          msg[9] = 'l';
          msg[10] = 'e';
          msg[0xb] = 'd';
          msg[0xc] = ':';
          msg[0xd] = ' ';
          msg[0xe] = '(';
          msg[0xf] = 'm';
          eVar10 = get_error_flags();
          if ((eVar10 & 1) != 0) {
            bVar9 = is_debugger_attached();
            if (bVar9) {
              pcVar2 = (code *)swi(3);
              (*pcVar2)();
              return;
            }
          }
          p_Var1 = (this->m_tree->m_callbacks).m_error;
          cVar16 = to_csubstr(
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             );
          local_d8 = cVar16.len;
          pcStack_e0 = cVar16.str;
          LVar6.super_LineCol.col = 0;
          LVar6.super_LineCol.offset = SUB168(ZEXT816(0x5961) << 0x40,0);
          LVar6.super_LineCol.line = SUB168(ZEXT816(0x5961) << 0x40,8);
          LVar6.name.str = pcStack_e0;
          LVar6.name.len = local_d8;
          (*p_Var1)(msg,0x2a,LVar6,(this->m_tree->m_callbacks).m_user_data);
        }
        NVar14 = Tree::type(this->m_tree,sVar12);
        if (((uint)NVar14.type >> 0xe & 1) != 0) {
          rc_00.num_times = sVar15;
          rc_00._0_8_ = 0x20;
          WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_do_write(&this->
                       super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ,rc_00);
          _do_visit_flow_sl(this,sVar12,0);
          goto LAB_00195731;
        }
        if ((short)NVar14.type < 0) {
          rc_01.num_times = sVar15;
          rc_01._0_8_ = 0x20;
          WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_do_write(&this->
                       super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ,rc_01);
          _do_visit_flow_ml(this,sVar12,0,1);
          goto LAB_00195731;
        }
        _do_visit_block(this,sVar12,next_level,do_indent);
      }
      sVar12 = Tree::next_sibling(this->m_tree,sVar12);
      sStackY_160 = 1;
      sVar15 = sVar3;
      do_indent = sStackY_160;
    }
  }
  else {
    sVar12 = Tree::first_child(this->m_tree,node);
    sVar15 = sVar3 * do_indent;
    while (sVar12 != 0xffffffffffffffff) {
      pNVar11 = Tree::_p(this->m_tree,sVar12);
      if (((pNVar11->m_type).type & KEY) != NOTYPE) {
        msg[0x10] = 'm';
        msg[0x11] = '_';
        msg[0x12] = 't';
        msg[0x13] = 'r';
        msg[0x14] = 'e';
        msg[0x15] = 'e';
        msg[0x16] = '-';
        msg[0x17] = '>';
        msg[0x18] = 'h';
        msg[0x19] = 'a';
        msg[0x1a] = 's';
        msg[0x1b] = '_';
        msg[0x1c] = 'k';
        msg[0x1d] = 'e';
        msg[0x1e] = 'y';
        msg[0x1f] = '(';
        msg[0] = 'c';
        msg[1] = 'h';
        msg[2] = 'e';
        msg[3] = 'c';
        msg[4] = 'k';
        msg[5] = ' ';
        msg[6] = 'f';
        msg[7] = 'a';
        msg[8] = 'i';
        msg[9] = 'l';
        msg[10] = 'e';
        msg[0xb] = 'd';
        msg[0xc] = ':';
        msg[0xd] = ' ';
        msg[0xe] = '(';
        msg[0xf] = '!';
        msg[0x20] = 'c';
        msg[0x21] = 'h';
        msg[0x22] = 'i';
        msg[0x23] = 'l';
        stack0xfffffffffffffefc = 0x292964;
        eVar10 = get_error_flags();
        if ((eVar10 & 1) != 0) {
          bVar9 = is_debugger_attached();
          if (bVar9) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
        }
        p_Var1 = (this->m_tree->m_callbacks).m_error;
        cVar16 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        local_38 = cVar16.len;
        pcStack_40 = cVar16.str;
        LVar7.super_LineCol.col = 0;
        LVar7.super_LineCol.offset = SUB168(ZEXT816(0x592e) << 0x40,0);
        LVar7.super_LineCol.line = SUB168(ZEXT816(0x592e) << 0x40,8);
        LVar7.name.str = pcStack_40;
        LVar7.name.len = local_38;
        (*p_Var1)(msg,0x28,LVar7,(this->m_tree->m_callbacks).m_user_data);
      }
      pNVar11 = Tree::_p(this->m_tree,sVar12);
      if (((pNVar11->m_type).type & KEYVAL) == VAL) {
        rc_02.num_times = sVar15;
        rc_02._0_8_ = 0x20;
        WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(&this->
                     super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ,rc_02);
        WriterOStream<std::__cxx11::ostringstream>::_do_write<3ul>
                  ((WriterOStream<std::__cxx11::ostringstream> *)this,(char (*) [3])0x1f9bd8);
        pNVar13 = Tree::valsc(this->m_tree,sVar12);
        pNVar11 = Tree::_p(this->m_tree,sVar12);
        _write(this,(int)pNVar13,(void *)(ulong)((uint)(pNVar11->m_type).type & 0x5541281),
               next_level);
LAB_001959e9:
        WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(&this->
                     super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ,'\n');
      }
      else {
        pNVar11 = Tree::_p(this->m_tree,sVar12);
        if (((pNVar11->m_type).type & (STREAM|MAP)) == NOTYPE) {
          msg[0x20] = 'n';
          msg[0x21] = 'e';
          msg[0x22] = 'r';
          msg[0x23] = '(';
          stack0xfffffffffffffefc = 0x6c696863;
          msg[0x10] = '_';
          msg[0x11] = 't';
          msg[0x12] = 'r';
          msg[0x13] = 'e';
          msg[0x14] = 'e';
          msg[0x15] = '-';
          msg[0x16] = '>';
          msg[0x17] = 'i';
          msg[0x18] = 's';
          msg[0x19] = '_';
          msg[0x1a] = 'c';
          msg[0x1b] = 'o';
          msg[0x1c] = 'n';
          msg[0x1d] = 't';
          msg[0x1e] = 'a';
          msg[0x1f] = 'i';
          msg[0] = 'c';
          msg[1] = 'h';
          msg[2] = 'e';
          msg[3] = 'c';
          msg[4] = 'k';
          msg[5] = ' ';
          msg[6] = 'f';
          msg[7] = 'a';
          msg[8] = 'i';
          msg[9] = 'l';
          msg[10] = 'e';
          msg[0xb] = 'd';
          msg[0xc] = ':';
          msg[0xd] = ' ';
          msg[0xe] = '(';
          msg[0xf] = 'm';
          eVar10 = get_error_flags();
          if ((eVar10 & 1) != 0) {
            bVar9 = is_debugger_attached();
            if (bVar9) {
              pcVar2 = (code *)swi(3);
              (*pcVar2)();
              return;
            }
          }
          p_Var1 = (this->m_tree->m_callbacks).m_error;
          cVar16 = to_csubstr(
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             );
          local_60 = cVar16.len;
          pcStack_68 = cVar16.str;
          LVar8.super_LineCol.col = 0;
          LVar8.super_LineCol.offset = SUB168(ZEXT816(0x5938) << 0x40,0);
          LVar8.super_LineCol.line = SUB168(ZEXT816(0x5938) << 0x40,8);
          LVar8.name.str = pcStack_68;
          LVar8.name.len = local_60;
          (*p_Var1)(msg,0x2c,LVar8,(this->m_tree->m_callbacks).m_user_data);
        }
        NVar14 = Tree::type(this->m_tree,sVar12);
        if (((uint)NVar14.type >> 0xe & 1) != 0) {
          rc_03.num_times = sVar15;
          rc_03._0_8_ = 0x20;
          WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_do_write(&this->
                       super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ,rc_03);
          WriterOStream<std::__cxx11::ostringstream>::_do_write<3ul>
                    ((WriterOStream<std::__cxx11::ostringstream> *)this,(char (*) [3])0x1f9bd8);
          _do_visit_flow_sl(this,sVar12,0);
          goto LAB_001959e9;
        }
        if ((short)NVar14.type < 0) {
          rc_04.num_times = sVar15;
          rc_04._0_8_ = 0x20;
          WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_do_write(&this->
                       super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ,rc_04);
          WriterOStream<std::__cxx11::ostringstream>::_do_write<3ul>
                    ((WriterOStream<std::__cxx11::ostringstream> *)this,(char (*) [3])0x1f9bd8);
          _do_visit_flow_ml(this,sVar12,next_level,do_indent);
          goto LAB_001959e9;
        }
        _do_visit_block(this,sVar12,next_level,do_indent);
      }
      sVar12 = Tree::next_sibling(this->m_tree,sVar12);
      sStackY_160 = 1;
      sVar15 = sVar3;
      do_indent = sStackY_160;
    }
  }
  return;
}

Assistant:

void Emitter<Writer>::_do_visit_block_container(size_t node, size_t next_level, size_t do_indent)
{
    RepC ind = indent_to(do_indent * next_level);

    if(m_tree->is_seq(node))
    {
        for(size_t child = m_tree->first_child(node); child != NONE; child = m_tree->next_sibling(child))
        {
            _RYML_CB_ASSERT(m_tree->callbacks(), !m_tree->has_key(child));
            if(m_tree->is_val(child))
            {
                this->Writer::_do_write(ind);
                this->Writer::_do_write("- ");
                _writev(child, next_level);
                this->Writer::_do_write('\n');
            }
            else
            {
                _RYML_CB_ASSERT(m_tree->callbacks(), m_tree->is_container(child));
                NodeType ty = m_tree->type(child);
                if(ty.marked_flow_sl())
                {
                    this->Writer::_do_write(ind);
                    this->Writer::_do_write("- ");
                    _do_visit_flow_sl(child, 0u);
                    this->Writer::_do_write('\n');
                }
                else if(ty.marked_flow_ml())
                {
                    this->Writer::_do_write(ind);
                    this->Writer::_do_write("- ");
                    _do_visit_flow_ml(child, next_level, do_indent);
                    this->Writer::_do_write('\n');
                }
                else
                {
                    _do_visit_block(child, next_level, do_indent);
                }
            }
            do_indent = true;
            ind = indent_to(do_indent * next_level);
        }
    }
    else // map
    {
        _RYML_CB_ASSERT(m_tree->callbacks(), m_tree->is_map(node));
        for(size_t ich = m_tree->first_child(node); ich != NONE; ich = m_tree->next_sibling(ich))
        {
            _RYML_CB_ASSERT(m_tree->callbacks(), m_tree->has_key(ich));
            if(m_tree->is_keyval(ich))
            {
                this->Writer::_do_write(ind);
                _writek(ich, next_level);
                this->Writer::_do_write(": ");
                _writev(ich, next_level);
                this->Writer::_do_write('\n');
            }
            else
            {
                _RYML_CB_ASSERT(m_tree->callbacks(), m_tree->is_container(ich));
                NodeType ty = m_tree->type(ich);
                if(ty.marked_flow_sl())
                {
                    this->Writer::_do_write(ind);
                    _do_visit_flow_sl(ich, 0u);
                    this->Writer::_do_write('\n');
                }
                else if(ty.marked_flow_ml())
                {
                    this->Writer::_do_write(ind);
                    _do_visit_flow_ml(ich, 0u);
                    this->Writer::_do_write('\n');
                }
                else
                {
                    _do_visit_block(ich, next_level, do_indent);
                }
            }
            do_indent = true;
            ind = indent_to(do_indent * next_level);
        }
    }
}